

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O0

void LoadObjects(Level *NewLev)

{
  int iVar1;
  Object *pOVar2;
  long in_RDI;
  bool bVar3;
  int Finished;
  Object *Obj;
  
  ExpectToken(TK_OPENBRACE);
  do {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    pOVar2 = NewObject();
    *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + 1;
    ExpectToken(TK_OPENBRACE);
    pOVar2->Pos[0] = Token.FQuantity;
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    pOVar2->Pos[1] = Token.FQuantity;
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    pOVar2->Angle = Token.FQuantity;
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    if (Token.IQuantity < 0) {
      pOVar2->ObjType = (ObjectType *)(in_RDI + 0xc0);
      pOVar2->Flags = pOVar2->Flags | 2;
      *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + -1;
    }
    else {
      pOVar2->ObjType = *(ObjectType **)(in_RDI + 0xb8);
      while( true ) {
        iVar1 = Token.IQuantity;
        bVar3 = pOVar2->ObjType != (ObjectType *)0x0;
        if (bVar3) {
          Token.IQuantity = Token.IQuantity + -1;
        }
        if (!bVar3 || iVar1 == 0) break;
        pOVar2->ObjType = pOVar2->ObjType->Next;
      }
      if (Token.IQuantity != -1) {
        Error = 1;
        snprintf(ErrorText,0x400,"Unknown object referenced at line %d",(ulong)(uint)Lines);
        return;
      }
    }
    GetToken();
    if (Token.Type != TK_CLOSEBRACE) {
      if (Token.Type != TK_COMMA) {
        Error = 1;
        return;
      }
      bVar3 = false;
      while (!bVar3) {
        GetToken();
        if (Token.Type == TK_CLOSEBRACE) {
          bVar3 = true;
        }
        else {
          if (Token.Type != TK_STRING) {
            Error = 1;
            return;
          }
          iVar1 = strcmp(Token.Text,"collidable");
          if (iVar1 == 0) {
            pOVar2->Flags = pOVar2->Flags | 0x100;
          }
          iVar1 = strcmp(Token.Text,"foreground");
          if (iVar1 == 0) {
            pOVar2->Flags = pOVar2->Flags | 0x200;
          }
        }
      }
    }
    pOVar2->Next = *(Object **)(in_RDI + 0x100);
    *(Object **)(in_RDI + 0x100) = pOVar2;
  } while( true );
}

Assistant:

void LoadObjects(struct Level *NewLev)
{
   struct Object *Obj;
   int Finished;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Obj = NewObject();
               NewLev->TotalObjects++;

               /* read location */
               ExpectToken(TK_NUMBER);
               Obj->Pos[0] = Token.FQuantity;
               ExpectToken(TK_COMMA);
               ExpectToken(TK_NUMBER);
               Obj->Pos[1] = Token.FQuantity;
               ExpectToken(TK_COMMA);

               /* read angle, convert into Allegro format */
               ExpectToken(TK_NUMBER);
               Obj->Angle = Token.FQuantity;
               ExpectToken(TK_COMMA);

               /* read object type, manipulate pointer */
               ExpectToken(TK_NUMBER);
               if (Token.IQuantity >= 0) {
                  Obj->ObjType = NewLev->AllObjectTypes;
                  while (Obj->ObjType && Token.IQuantity--)
                     Obj->ObjType = Obj->ObjType->Next;

                  if (Token.IQuantity != -1) {
                     Error = 1;
                     snprintf(ErrorText, sizeof(ErrorText),
                               "Unknown object referenced at line %d", Lines);
                     return;
                  }
               } else {
                  /* this is the door - a hard coded type */
                  Obj->ObjType = &NewLev->Door;
                  Obj->Flags |= OBJFLAGS_DOOR;
                  NewLev->TotalObjects--;
               }

               /* parse any flags that may exist */
               GetToken();
               switch (Token.Type) {
                  case TK_COMMA:
                     {
                        Finished = false;
                        while (!Finished) {
                           GetToken();
                           switch (Token.Type) {
                              case TK_CLOSEBRACE:
                                 Finished = true;
                                 break;
                              case TK_STRING:
                                 if (!strcmp(Token.Text, "collidable"))
                                    Obj->Flags |= FLAGS_COLLIDABLE;
                                 if (!strcmp(Token.Text, "foreground"))
                                    Obj->Flags |= FLAGS_FOREGROUND;
                                 break;
                              default:
                                 Error = 1;
                                 return;
                           }
                        }
                     }
                     break;
                  case TK_CLOSEBRACE:
                     break;
                  default:
                     Error = 1;
                     return;
               }

               /* thread into list */
               Obj->Next = NewLev->AllObjects;
               NewLev->AllObjects = Obj;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}